

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::parseTypeName(Parser *this,TypeNameSyntax **typeName)

{
  bool bVar1;
  TypeNameSyntax *pTVar2;
  SpecifierListSyntax *local_30;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  TypeNameSyntax **typeName_local;
  Parser *this_local;
  
  specList = (SpecifierListSyntax *)0x0;
  local_30 = (SpecifierListSyntax *)0x0;
  decl = (DeclarationSyntax *)typeName;
  typeName_local = (TypeNameSyntax **)this;
  bVar1 = parseSpecifierQualifierList(this,(DeclarationSyntax **)&specList,&local_30);
  if (bVar1) {
    pTVar2 = makeNode<psy::C::TypeNameSyntax>(this);
    (decl->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pTVar2;
    (decl->super_SyntaxNode).super_Managed._vptr_Managed[3] = (_func_int *)local_30;
    this_local._7_1_ =
         parseAbstractDeclarator
                   (this,(DeclaratorSyntax **)
                         ((decl->super_SyntaxNode).super_Managed._vptr_Managed + 4));
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseTypeName(TypeNameSyntax*& typeName)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseSpecifierQualifierList(decl, specList))
        return false;

    typeName = makeNode<TypeNameSyntax>();
    typeName->specs_ = specList;
    return parseAbstractDeclarator(typeName->decltor_);
}